

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

void xfer_cleanup(fxp_xfer *xfer)

{
  req *ptr;
  req *rr;
  fxp_xfer *xfer_local;
  
  while (xfer->head != (req *)0x0) {
    ptr = xfer->head;
    xfer->head = xfer->head->next;
    safefree(ptr->buffer);
    safefree(ptr);
  }
  safefree(xfer);
  return;
}

Assistant:

void xfer_cleanup(struct fxp_xfer *xfer)
{
    struct req *rr;
    while (xfer->head) {
        rr = xfer->head;
        xfer->head = xfer->head->next;
        sfree(rr->buffer);
        sfree(rr);
    }
    sfree(xfer);
}